

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O2

void __thiscall SuiteUtcTimeStampTests::Testsubtract::Testsubtract(Testsubtract *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"subtract","UtcTimeStampTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/UtcTimeStampTestCase.cpp"
             ,0x44);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00321490;
  return;
}

Assistant:

TEST(subtract)
{
  UtcTimeStamp sm( 10, 10, 10, 10, 10, 2000 );
  UtcTimeStamp lg( 10, 10, 20, 10, 10, 2000 );
  UtcTimeStamp mid( 10, 10, 15, 10, 10, 2000 );

  CHECK_EQUAL( 0, ( sm - sm ) );
  CHECK_EQUAL( -10, ( sm - lg ) );
  CHECK_EQUAL( -5, ( sm - mid ) );

  CHECK_EQUAL( 5, ( mid - sm ) );
  CHECK_EQUAL( -5, ( mid - lg ) );
  CHECK_EQUAL( 0, ( mid - mid ) );

  CHECK_EQUAL( 10, ( lg - sm ) );
  CHECK_EQUAL( 0, ( lg - lg ) );
  CHECK_EQUAL( 5, ( lg - mid ) );
}